

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# valid.c
# Opt level: O1

void xmlFreeID(xmlIDPtr id)

{
  xmlAttrPtr pxVar1;
  int iVar2;
  _xmlDict *dict;
  
  if (id == (xmlIDPtr)0x0) {
    return;
  }
  if (id->doc == (_xmlDoc *)0x0) {
    dict = (xmlDictPtr)0x0;
  }
  else {
    dict = id->doc->dict;
  }
  if (id->value != (xmlChar *)0x0) {
    if (dict != (xmlDictPtr)0x0) {
      iVar2 = xmlDictOwns(dict,id->value);
      if (iVar2 != 0) goto LAB_0015b75f;
    }
    (*xmlFree)(id->value);
  }
LAB_0015b75f:
  if (id->name != (xmlChar *)0x0) {
    if (dict != (xmlDictPtr)0x0) {
      iVar2 = xmlDictOwns(dict,id->name);
      if (iVar2 != 0) goto LAB_0015b786;
    }
    (*xmlFree)(id->name);
  }
LAB_0015b786:
  pxVar1 = id->attr;
  if (pxVar1 != (xmlAttrPtr)0x0) {
    pxVar1->id = (_xmlID *)0x0;
    pxVar1->atype = 0;
  }
  (*xmlFree)(id);
  return;
}

Assistant:

static void
xmlFreeID(xmlIDPtr id) {
    xmlDictPtr dict = NULL;

    if (id == NULL) return;

    if (id->doc != NULL)
        dict = id->doc->dict;

    if (id->value != NULL)
	DICT_FREE(id->value)
    if (id->name != NULL)
	DICT_FREE(id->name)
    if (id->attr != NULL) {
        id->attr->id = NULL;
        id->attr->atype = 0;
    }

    xmlFree(id);
}